

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingTest.cpp
# Opt level: O2

void threadFunc(void)

{
  int v;
  Logger local_1000;
  
  for (v = 0; v != 100000; v = v + 1) {
    Logger::Logger(&local_1000,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/tests/LoggingTest.cpp"
                   ,0x10);
    LogStream::operator<<((LogStream *)&local_1000,v);
    Logger::~Logger(&local_1000);
  }
  return;
}

Assistant:

void threadFunc()
{
    for (int i = 0; i < 100000; ++i)
    {
        LOG << i;
    }
}